

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprc_identity(lys_ypr_ctx *pctx,lysc_ident *ident)

{
  LY_ERR LVar1;
  uint local_74;
  uint local_64;
  lysc_ident *local_58;
  uint local_44;
  uint local_34;
  lysc_ident *local_28;
  uint64_t u;
  lysc_ident *plStack_18;
  ly_bool flag;
  lysc_ident *ident_local;
  lys_ypr_ctx *pctx_local;
  
  u._7_1_ = '\0';
  if (((pctx->field_0).field_0.options & 2) == 0) {
    local_34 = (uint)(pctx->field_0).field_0.level << 1;
  }
  else {
    local_34 = 0;
  }
  plStack_18 = ident;
  ident_local = (lysc_ident *)pctx;
  ly_print_((pctx->field_0).field_0.out,"%*sidentity %s",(ulong)local_34,"",ident->name);
  *(short *)&ident_local->dsc = *(short *)&ident_local->dsc + 1;
  yprc_extension_instances
            ((lys_ypr_ctx *)ident_local,LY_STMT_IDENTITY,'\0',plStack_18->exts,
             (ly_bool *)((long)&u + 7));
  ypr_open((ly_out *)ident_local->name,(ly_bool *)((long)&u + 7));
  LVar1 = lys_identity_iffeature_value(plStack_18);
  if (LVar1 == LY_ENOT) {
    if (((ulong)ident_local->dsc & 0x200000000) == 0) {
      local_44 = (uint)*(ushort *)&ident_local->dsc << 1;
    }
    else {
      local_44 = 0;
    }
    ly_print_((ly_out *)ident_local->name,"%*s/* identity \"%s\" is disabled by if-feature(s) */\n",
              (ulong)local_44,"",plStack_18->name);
  }
  local_28 = (lysc_ident *)0x0;
  while( true ) {
    if (plStack_18->derived == (lysc_ident **)0x0) {
      local_58 = (lysc_ident *)0x0;
    }
    else {
      local_58 = plStack_18->derived[-1];
    }
    if (local_58 <= local_28) break;
    if ((lys_module *)ident_local->ref == plStack_18->derived[(long)local_28]->module) {
      if (((ulong)ident_local->dsc & 0x200000000) == 0) {
        local_74 = (uint)*(ushort *)&ident_local->dsc << 1;
      }
      else {
        local_74 = 0;
      }
      ly_print_((ly_out *)ident_local->name,"%*sderived %s;\n",(ulong)local_74,"",
                plStack_18->derived[(long)local_28]->name);
    }
    else {
      if (((ulong)ident_local->dsc & 0x200000000) == 0) {
        local_64 = (uint)*(ushort *)&ident_local->dsc << 1;
      }
      else {
        local_64 = 0;
      }
      ly_print_((ly_out *)ident_local->name,"%*sderived %s:%s;\n",(ulong)local_64,"",
                plStack_18->derived[(long)local_28]->module->prefix,
                plStack_18->derived[(long)local_28]->name);
    }
    local_28 = (lysc_ident *)((long)&local_28->name + 1);
  }
  ypr_status((lys_ypr_ctx *)ident_local,plStack_18->flags,plStack_18->exts,(ly_bool *)((long)&u + 7)
            );
  ypr_description((lys_ypr_ctx *)ident_local,plStack_18->dsc,plStack_18->exts,
                  (ly_bool *)((long)&u + 7));
  ypr_reference((lys_ypr_ctx *)ident_local,plStack_18->ref,plStack_18->exts,
                (ly_bool *)((long)&u + 7));
  *(short *)&ident_local->dsc = *(short *)&ident_local->dsc + -1;
  ypr_close((lys_ypr_ctx *)ident_local,u._7_1_);
  return;
}

Assistant:

static void
yprc_identity(struct lys_ypr_ctx *pctx, const struct lysc_ident *ident)
{
    ly_bool flag = 0;
    LY_ARRAY_COUNT_TYPE u;

    ly_print_(pctx->out, "%*sidentity %s", INDENT, ident->name);
    LEVEL++;

    yprc_extension_instances(pctx, LY_STMT_IDENTITY, 0, ident->exts, &flag);

    ypr_open(pctx->out, &flag);
    if (lys_identity_iffeature_value(ident) == LY_ENOT) {
        ly_print_(pctx->out, "%*s/* identity \"%s\" is disabled by if-feature(s) */\n", INDENT, ident->name);
    }

    LY_ARRAY_FOR(ident->derived, u) {
        if (pctx->module != ident->derived[u]->module) {
            ly_print_(pctx->out, "%*sderived %s:%s;\n", INDENT, ident->derived[u]->module->prefix, ident->derived[u]->name);
        } else {
            ly_print_(pctx->out, "%*sderived %s;\n", INDENT, ident->derived[u]->name);
        }
    }

    ypr_status(pctx, ident->flags, ident->exts, &flag);
    ypr_description(pctx, ident->dsc, ident->exts, &flag);
    ypr_reference(pctx, ident->ref, ident->exts, &flag);

    LEVEL--;
    ypr_close(pctx, flag);
}